

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void enterinc(global_State *g)

{
  byte bVar1;
  GCObject *pGVar2;
  
  bVar1 = g->currentwhite & 0x18;
  for (pGVar2 = g->allgc; pGVar2 != (GCObject *)0x0; pGVar2 = pGVar2->next) {
    pGVar2->marked = pGVar2->marked & 0xc0 | bVar1;
  }
  g->survival = (GCObject *)0x0;
  g->old1 = (GCObject *)0x0;
  g->reallyold = (GCObject *)0x0;
  for (pGVar2 = g->finobj; pGVar2 != (GCObject *)0x0; pGVar2 = pGVar2->next) {
    pGVar2->marked = pGVar2->marked & 0xc0 | bVar1;
  }
  for (pGVar2 = g->tobefnz; pGVar2 != (GCObject *)0x0; pGVar2 = pGVar2->next) {
    pGVar2->marked = pGVar2->marked & 0xc0 | bVar1;
  }
  g->finobjsur = (GCObject *)0x0;
  g->finobjold1 = (GCObject *)0x0;
  g->finobjrold = (GCObject *)0x0;
  g->gcstate = '\b';
  g->gckind = '\0';
  g->lastatomic = 0;
  return;
}

Assistant:

static void enterinc (global_State *g) {
  whitelist(g, g->allgc);
  g->reallyold = g->old1 = g->survival = NULL;
  whitelist(g, g->finobj);
  whitelist(g, g->tobefnz);
  g->finobjrold = g->finobjold1 = g->finobjsur = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->lastatomic = 0;
}